

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitStructRMW(OptimizeInstructions *this,StructRMW *curr)

{
  Expression **input;
  uintptr_t uVar1;
  Op op;
  bool bVar2;
  Index index;
  Index IVar3;
  Index index_00;
  BinaryOp op_00;
  Expression *pEVar4;
  int64_t iVar5;
  LocalGet *pLVar6;
  StructGet *pSVar7;
  Drop *second;
  LocalGet *right;
  StructSet *item;
  ulong extraout_RDX;
  ExpressionList *this_00;
  optional<wasm::Type> type;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  Block *local_70;
  Index local_64;
  undefined1 local_60 [8];
  Literal val;
  Builder local_38;
  Builder builder;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if (bVar2) {
    return;
  }
  bVar2 = wasm::Type::isStruct(&(*input)->type);
  if (!bVar2) {
    return;
  }
  local_60 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  bVar2 = HeapType::isShared((HeapType *)local_60);
  if ((bVar2) && (curr->order == SeqCst)) {
    return;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pEVar4 = getFallthrough(this,curr->value);
  bVar2 = Properties::isSingleConstantExpression(pEVar4);
  if (bVar2) {
    Properties::getLiteral((Literal *)local_60,pEVar4);
    if (curr->op < RMWXchg) {
      if (curr->op == RMWAnd) {
        Literal::makeNegOne((Literal *)&local_88.func,
                            (Type)val.field_0.gcData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
        bVar2 = Literal::operator==((Literal *)local_60,(Literal *)&local_88.func);
        Literal::~Literal((Literal *)&local_88.func);
        if (bVar2) goto LAB_00add363;
      }
      else {
        iVar5 = Literal::getInteger((Literal *)local_60);
        if (iVar5 == 0) {
LAB_00add363:
          IVar3 = curr->index;
          pEVar4 = curr->ref;
          second = Builder::makeDrop(&local_38,curr->value);
          pEVar4 = getResultOfFirst(this,pEVar4,(Expression *)second);
          pSVar7 = Builder::makeStructGet
                             (&local_38,IVar3,pEVar4,curr->order,
                              (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                    super_Expression.type.id,false);
          replaceCurrent(this,(Expression *)pSVar7);
          Literal::~Literal((Literal *)local_60);
          return;
        }
      }
    }
    Literal::~Literal((Literal *)local_60);
  }
  local_60 = (undefined1  [8])wasm::Type::getHeapType(&(*input)->type);
  bVar2 = HeapType::isShared((HeapType *)local_60);
  if (bVar2) {
    return;
  }
  index = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,(Type)(curr->ref->type).id);
  IVar3 = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currFunction,
                          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                super_Expression.type.id);
  index_00 = Builder::addVar((this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currFunction,
                             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                   super_Expression.type.id);
  local_60 = (undefined1  [8])Builder::makeLocalSet(&local_38,index,curr->ref);
  val.type.id._0_4_ = IVar3;
  val.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)Builder::makeLocalSet(&local_38,IVar3,curr->value);
  IVar3 = curr->index;
  uVar1 = (curr->ref->type).id;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar6->index = index;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  local_64 = index;
  pSVar7 = Builder::makeStructGet
                     (&local_38,IVar3,(Expression *)pLVar6,Unordered,
                      (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                            super_Expression.type.id,false);
  val.field_0.func.super_IString.str._M_str =
       (char *)Builder::makeLocalSet(&local_38,index_00,(Expression *)pSVar7);
  local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60;
  local_88.func.super_IString.str._M_str = (char *)0x3;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_70 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_38,(initializer_list<wasm::Expression_*> *)&local_88.func,type);
  switch(curr->op) {
  case RMWSub:
    op = Sub;
    break;
  case RMWAnd:
    op = And;
    break;
  case RMWOr:
    op = Or;
    break;
  case RMWXor:
    op = Xor;
    break;
  case RMWXchg:
    uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar6->index = (Index)val.type.id;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    val.type.id = (uintptr_t)pLVar6;
    goto LAB_00add453;
  default:
    op = Add;
  }
  op_00 = Abstract::getBinary((Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).
                                    super_Expression.type.id,op);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar6->index = index_00;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  right = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  right->index = (Index)val.type.id;
  (right->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  val.type.id = (uintptr_t)
                Builder::makeBinary(&local_38,op_00,(Expression *)pLVar6,(Expression *)right);
LAB_00add453:
  this_00 = &local_70->list;
  IVar3 = curr->index;
  uVar1 = (curr->ref->type).id;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar6->index = local_64;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  item = Builder::makeStructSet
                   (&local_38,IVar3,(Expression *)pLVar6,(Expression *)val.type.id,Unordered);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar6->index = index_00;
  (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pLVar6);
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       (curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type.id;
  replaceCurrent(this,(Expression *)local_70);
  return;
}

Assistant:

void visitStructRMW(StructRMW* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    // We generally can't optimize seqcst RMWs on shared memory because they can
    // act as both the source and sink of synchronization edges, even if they
    // don't modify the in-memory value.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    Builder builder(*getModule());

    // This RMW is either to non-shared memory or has acquire-release ordering.
    // In the former case, it trivially does not synchronize with other threads
    // and we can optimize to our heart's content. In the latter case, if we
    // know the RMW does not change the value in memory, then we can consider
    // all subsequent reads as reading from the previous write rather than from
    // this RMW op, which means this RMW does not synchronize with later reads
    // and we can optimize out the write part. This optimization wouldn't be
    // valid for sequentially consistent RMW ops because the next reads from
    // this location in the total order of seqcst ops would have to be
    // considered to be reading from this RMW and therefore would synchronize
    // with it.
    auto* value = getFallthrough(curr->value);
    if (Properties::isSingleConstantExpression(value)) {
      auto val = Properties::getLiteral(value);
      bool canOptimize = false;
      switch (curr->op) {
        case RMWAdd:
        case RMWSub:
        case RMWOr:
        case RMWXor:
          canOptimize = val.getInteger() == 0;
          break;
        case RMWAnd:
          canOptimize = val == Literal::makeNegOne(val.type);
          break;
        case RMWXchg:
          canOptimize = false;
          break;
      }
      if (canOptimize) {
        replaceCurrent(builder.makeStructGet(
          curr->index,
          getResultOfFirst(curr->ref, builder.makeDrop(curr->value)),
          curr->order,
          curr->type));
        return;
      }
    }

    // No further optimizations possible on RMWs to shared memory.
    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Lower the RMW to its more basic operations. Breaking the atomic
    // operation into several non-atomic operations is safe because no other
    // thread can observe an intermediate state in the unshared memory. This
    // initially increases code size, but the more basic operations may be
    // more optimizable than the original RMW.
    // TODO: Experiment to determine whether this is worthwhile on real code.
    // Maybe we should do this optimization only when optimizing for speed over
    // size.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto val = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block = builder.makeBlock(
      {builder.makeLocalSet(ref, curr->ref),
       builder.makeLocalSet(val, curr->value),
       builder.makeLocalSet(
         result,
         builder.makeStructGet(curr->index,
                               builder.makeLocalGet(ref, curr->ref->type),
                               MemoryOrder::Unordered,
                               curr->type))});
    Expression* newVal = nullptr;
    if (curr->op == RMWXchg) {
      newVal = builder.makeLocalGet(val, curr->type);
    } else {
      Abstract::Op binop = Abstract::Add;
      switch (curr->op) {
        case RMWAdd:
          binop = Abstract::Add;
          break;
        case RMWSub:
          binop = Abstract::Sub;
          break;
        case RMWAnd:
          binop = Abstract::And;
          break;
        case RMWOr:
          binop = Abstract::Or;
          break;
        case RMWXor:
          binop = Abstract::Xor;
          break;
        case RMWXchg:
          WASM_UNREACHABLE("unexpected op");
      }
      newVal = builder.makeBinary(Abstract::getBinary(curr->type, binop),
                                  builder.makeLocalGet(result, curr->type),
                                  builder.makeLocalGet(val, curr->type));
    }
    block->list.push_back(
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            newVal,
                            MemoryOrder::Unordered));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }